

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O0

string * soul::convertToString(string *__return_storage_ptr__,string *name)

{
  string *name_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  return __return_storage_ptr__;
}

Assistant:

std::string convertToString (const std::string& name)        { return name; }